

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::str<capnp::Void_const&>(String *__return_storage_ptr__,kj *this,Void *params)

{
  char *local_18;
  undefined8 local_10;
  
  local_18 = "void";
  local_10 = 5;
  _::concat<kj::StringPtr>(__return_storage_ptr__,(_ *)&local_18,(StringPtr *)params);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}